

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O1

tool_t * create_tool(char *tool_name)

{
  tool_t *new_tool;
  
  if (0 < debug_level) {
    create_tool_cold_1();
  }
  new_tool = (tool_t *)malloc(0x58);
  if (new_tool == (tool_t *)0x0) {
    if (debug_level != 0) {
      create_tool_cold_3();
    }
    new_tool = (tool_t *)0x0;
  }
  else {
    new_tool->tool_name = tool_name;
    new_tool->binding = (binding_t *)0x0;
    (new_tool->config).priority = -1;
    reorder_tool(new_tool);
    new_tool->parent_tool = (tool_t *)0x0;
    create_hashtable(&new_tool->child_tools,0x18,strhash,strcmp);
    if (0 < debug_level) {
      create_tool_cold_2();
    }
  }
  return new_tool;
}

Assistant:

tool_t *create_tool(const char *tool_name)
{
   debug_printf(1, "Found no existing tool with name %s\n",tool_name);
   // TODO: ensure free
   tool_t *newtool = (tool_t *) gotcha_malloc(sizeof(tool_t));
   if (!newtool) {
      error_printf("Failed to malloc tool %s\n", tool_name);
      return NULL;
   }
   newtool->tool_name = tool_name;
   newtool->binding = NULL;
   //newtool->next_tool = tools;
   newtool->config = get_default_configuration();
   reorder_tool(newtool);
   newtool->parent_tool = NULL;
   create_hashtable(&newtool->child_tools, 24, 
     (hash_func_t) strhash, (hash_cmp_t) gotcha_strcmp);
   //tools = newtool;
   debug_printf(1, "Created new tool %s\n", tool_name);
   return newtool;
}